

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TextureUnitCase::upload3dTexture
          (TextureUnitCase *this,int texNdx,Context *context)

{
  Texture3D *pTVar1;
  deUint32 err;
  TextureFormat texFormat;
  TransferFormat TVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  pTVar1 = (this->m_textures3d).
           super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>._M_impl.
           super__Vector_impl_data._M_start
           [(this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[texNdx]];
  texFormat = glu::mapGLInternalFormat
                        ((this->m_textureParams).
                         super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                         ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat);
  TVar2 = glu::getTransferFormat(texFormat);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  lVar3 = *(long *)&(pTVar1->super_TextureLevelPyramid).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data;
  if (0 < (int)((ulong)((long)(pTVar1->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar3) >> 3) *
          -0x33333333) {
    lVar4 = 8;
    uVar5 = 0;
    lVar6 = 8;
    do {
      if (*(long *)(*(long *)&(pTVar1->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data + lVar6) != 0) {
        (*context->_vptr_Context[0x12])
                  (context,0x806f,uVar5 & 0xffffffff,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat,
                   (ulong)*(uint *)(lVar3 + lVar4),(ulong)*(uint *)(lVar3 + 4 + lVar4),
                   (ulong)*(uint *)(lVar3 + 8 + lVar4),0,TVar2,(ulong)TVar2 >> 0x20,
                   *(undefined8 *)(lVar3 + 0x18 + lVar4));
        err = (*context->_vptr_Context[0x79])(context);
        glu::checkError(err,"Set 3d texture image data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                        ,0x482);
      }
      uVar5 = uVar5 + 1;
      lVar3 = *(long *)&(pTVar1->super_TextureLevelPyramid).m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data;
      lVar6 = lVar6 + 0x10;
      lVar4 = lVar4 + 0x28;
    } while ((long)uVar5 <
             (long)((int)((ulong)((long)(pTVar1->super_TextureLevelPyramid).m_access.
                                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - lVar3) >> 3) *
                   -0x33333333));
  }
  return;
}

Assistant:

void TextureUnitCase::upload3dTexture (int texNdx, sglr::Context& context)
{
	int							ndx3d		= m_ndxTexType[texNdx];
	const tcu::Texture3D*		texture		= m_textures3d[ndx3d];
	glu::TransferFormat			formatGl	= glu::getTransferFormat(glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat));

	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	for (int levelNdx = 0; levelNdx < texture->getNumLevels(); levelNdx++)
	{
		if (texture->isLevelEmpty(levelNdx))
			continue;

		tcu::ConstPixelBufferAccess	access	= texture->getLevel(levelNdx);
		int							width	= access.getWidth();
		int							height	= access.getHeight();
		int							depth	= access.getDepth();

		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);
		DE_ASSERT(access.getSlicePitch() == access.getFormat().getPixelSize()*width*height);

		context.texImage3D(GL_TEXTURE_3D, levelNdx, m_textureParams[texNdx].internalFormat, width, height, depth, 0 /* border */, formatGl.format, formatGl.dataType, access.getDataPtr());
		GLU_EXPECT_NO_ERROR(context.getError(), "Set 3d texture image data");
	}
}